

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O3

void displayMessage(MessageType t,ostringstream *msg)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  int in_ECX;
  long *plVar4;
  size_type sVar5;
  _Alloc_hider _Var6;
  string stack;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  if (t == AUTHOR_ERROR) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)msg,
               "This error is for project developers. Use -Wno-error=dev to suppress it.",0x48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"\n",1);
  }
  else {
    if (t == AUTHOR_WARNING) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)msg,
                 "This warning is for project developers.  Use -Wno-dev to suppress it.",0x45);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"\n",1);
LAB_004206f6:
      std::__cxx11::stringbuf::str();
      cmSystemTools::Message(local_80._M_dataplus._M_p,"Warning");
      goto LAB_00420770;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"\n",1);
    if ((t != FATAL_ERROR) && (t != DEPRECATION_ERROR)) {
      if (t != INTERNAL_ERROR) goto LAB_004206f6;
      cmsys::SystemInformation::GetProgramStack_abi_cxx11_
                (&local_80,(SystemInformation *)0x0,0,in_ECX);
      sVar5 = local_80._M_string_length;
      _Var6._M_p = local_80._M_dataplus._M_p;
      if (local_80._M_string_length != 0) {
        iVar1 = strncmp(local_80._M_dataplus._M_p,"WARNING:",8);
        if (iVar1 == 0) {
          std::__cxx11::string::substr((ulong)local_60,(ulong)&local_80);
          plVar2 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x583cf8);
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_30 = *plVar4;
            lStack_28 = plVar2[3];
            local_40 = &local_30;
          }
          else {
            local_30 = *plVar4;
            local_40 = (long *)*plVar2;
          }
          local_38 = plVar2[1];
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_80,(string *)&local_40);
          if (local_40 != &local_30) {
            operator_delete(local_40,local_30 + 1);
          }
          sVar5 = local_80._M_string_length;
          _Var6._M_p = local_80._M_dataplus._M_p;
          if (local_60[0] != local_50) {
            operator_delete(local_60[0],local_50[0] + 1);
            sVar5 = local_80._M_string_length;
            _Var6._M_p = local_80._M_dataplus._M_p;
          }
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,_Var6._M_p,sVar5)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
  }
  cmSystemTools::s_ErrorOccured = true;
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(local_80._M_dataplus._M_p,"Error");
LAB_00420770:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void displayMessage(cmake::MessageType t, std::ostringstream& msg)
{
  // Add a note about warning suppression.
  if (t == cmake::AUTHOR_WARNING) {
    msg << "This warning is for project developers.  Use -Wno-dev to suppress "
           "it.";
  } else if (t == cmake::AUTHOR_ERROR) {
    msg << "This error is for project developers. Use -Wno-error=dev to "
           "suppress "
           "it.";
  }

  // Add a terminating blank line.
  msg << "\n";

#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Add a C++ stack trace to internal errors.
  if (t == cmake::INTERNAL_ERROR) {
    std::string stack = cmsys::SystemInformation::GetProgramStack(0, 0);
    if (!stack.empty()) {
      if (cmHasLiteralPrefix(stack, "WARNING:")) {
        stack = "Note:" + stack.substr(8);
      }
      msg << stack << "\n";
    }
  }
#endif

  // Output the message.
  if (t == cmake::FATAL_ERROR || t == cmake::INTERNAL_ERROR ||
      t == cmake::DEPRECATION_ERROR || t == cmake::AUTHOR_ERROR) {
    cmSystemTools::SetErrorOccured();
    cmSystemTools::Message(msg.str().c_str(), "Error");
  } else {
    cmSystemTools::Message(msg.str().c_str(), "Warning");
  }
}